

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableFunctionRef::Copy(TableFunctionRef *this)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  tuple<duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_> this_00;
  pointer pPVar3;
  pointer pTVar4;
  type target;
  pointer *__ptr;
  TableRef *in_RSI;
  templated_unique_single_t copy;
  __uniq_ptr_impl<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>_> local_28
  ;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
  .super__Head_base<0UL,_duckdb::TableFunctionRef_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
       )operator_new(0x78);
  TableFunctionRef((TableFunctionRef *)
                   this_00.
                   super__Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
                   .super__Head_base<0UL,_duckdb::TableFunctionRef_*,_false>._M_head_impl);
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
  .super__Head_base<0UL,_duckdb::TableFunctionRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>)
       (tuple<duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
       .super__Head_base<0UL,_duckdb::TableFunctionRef_*,_false>._M_head_impl;
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 1));
  (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar3);
  pTVar4 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)&local_28);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (ParsedExpression *)0x0;
  _Var1._M_head_impl =
       (pTVar4->function).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pTVar4->function).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  pTVar4 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)&local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pTVar4->super_TableRef).column_name_alias,
              &(in_RSI->column_name_alias).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  target = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
           ::operator*((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                        *)&local_28);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFunctionRef_*,_std::default_delete<duckdb::TableFunctionRef>_>
       .super__Head_base<0UL,_duckdb::TableFunctionRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> TableFunctionRef::Copy() {
	auto copy = make_uniq<TableFunctionRef>();

	copy->function = function->Copy();
	copy->column_name_alias = column_name_alias;
	CopyProperties(*copy);

	return std::move(copy);
}